

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall Graph::show_node_info(Graph *this)

{
  ostream *poVar1;
  long in_RDI;
  int i;
  int local_c;
  
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"idx,x,y,demand,tw_open,tw_close,unload_time");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_c = 0; local_c < *(int *)(in_RDI + 0xc); local_c = local_c + 1) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        *(int *)(*(long *)(in_RDI + 0x18) + (long)local_c * 0x20 + 8));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)(*(long *)(in_RDI + 0x18) + (long)local_c * 0x20));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)(*(long *)(in_RDI + 0x18) + (long)local_c * 0x20 + 4));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)(*(long *)(in_RDI + 0x18) + (long)local_c * 0x20 + 0xc));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)(*(long *)(in_RDI + 0x18) + (long)local_c * 0x20 + 0x14));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)(*(long *)(in_RDI + 0x18) + (long)local_c * 0x20 + 0x18));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,*(int *)(*(long *)(in_RDI + 0x18) + (long)local_c * 0x20 + 0x1c));
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Graph::show_node_info() const
{
	std::cout << std::endl << "idx,x,y,demand,tw_open,tw_close,unload_time" << std::endl;
	for(int i = 0; i < num_node; i++){
		std::cout << nodes[i].idx << " " << nodes[i].x << " " << nodes[i].y << " " << nodes[i].demand << \
			" " << nodes[i].tw_open << " " << nodes[i].tw_close << " " << nodes[i].unload_time << std::endl;
	}
}